

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O3

CURLcode Curl_output_digest(Curl_easy *data,_Bool proxy,uchar *request,uchar *uripath)

{
  byte bVar1;
  CURLcode CVar2;
  char *pcVar3;
  uchar *puVar4;
  long lVar5;
  int iVar6;
  undefined7 in_register_00000031;
  digestdata *digest;
  char *pcVar7;
  uint uVar8;
  char *passwdp;
  char *response;
  long local_50;
  uchar *local_48;
  uchar *local_40;
  size_t len;
  
  iVar6 = (int)CONCAT71(in_register_00000031,proxy);
  uVar8 = iVar6 << 5;
  digest = &(data->state).digest;
  lVar5 = 0x12f0;
  if (iVar6 != 0) {
    lVar5 = 0x12d8;
    digest = &(data->state).proxydigest;
  }
  pcVar7 = *(char **)((long)&(data->state).aptr.user + (ulong)(uint)(iVar6 << 4));
  passwdp = *(char **)((data->info).conn_primary_ip + ((ulong)(uint)(iVar6 << 4) - 0x7c));
  local_48 = request;
  local_40 = uripath;
  (*Curl_cfree)(*(void **)((long)&data->magic + lVar5));
  puVar4 = local_40;
  if (pcVar7 == (char *)0x0) {
    pcVar7 = "";
  }
  if (passwdp == (char *)0x0) {
    passwdp = "";
  }
  *(undefined8 *)((long)&data->magic + lVar5) = 0;
  bVar1 = (&(data->state).authhost.field_0x18)[uVar8];
  if (digest->nonce == (char *)0x0) {
    bVar1 = bVar1 & 0xfe;
  }
  else {
    local_50 = lVar5;
    if (((bVar1 & 4) == 0) || (pcVar3 = strchr((char *)local_40,0x3f), pcVar3 == (char *)0x0)) {
      puVar4 = (uchar *)(*Curl_cstrdup)((char *)puVar4);
    }
    else {
      puVar4 = (uchar *)curl_maprintf("%.*s",(ulong)(uint)((int)pcVar3 - (int)puVar4),puVar4);
    }
    if (puVar4 == (uchar *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar2 = Curl_auth_create_digest_http_message
                      (data,pcVar7,passwdp,local_48,puVar4,digest,&response,&len);
    (*Curl_cfree)(puVar4);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    pcVar7 = "";
    if (proxy) {
      pcVar7 = "Proxy-";
    }
    pcVar7 = curl_maprintf("%sAuthorization: Digest %s\r\n",pcVar7,response);
    lVar5 = local_50;
    *(char **)((long)&data->magic + local_50) = pcVar7;
    (*Curl_cfree)(response);
    if (*(long *)((long)&data->magic + lVar5) == 0) {
      return CURLE_OUT_OF_MEMORY;
    }
    bVar1 = (&(data->state).authhost.field_0x18)[uVar8] | 1;
  }
  (&(data->state).authhost.field_0x18)[uVar8] = bVar1;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_output_digest(struct Curl_easy *data,
                            bool proxy,
                            const unsigned char *request,
                            const unsigned char *uripath)
{
  CURLcode result;
  unsigned char *path = NULL;
  char *tmp = NULL;
  char *response;
  size_t len;
  bool have_chlg;

  /* Point to the address of the pointer that holds the string to send to the
     server, which is for a plain host or for an HTTP proxy */
  char **allocuserpwd;

  /* Point to the name and password for this */
  const char *userp;
  const char *passwdp;

  /* Point to the correct struct with this */
  struct digestdata *digest;
  struct auth *authp;

  if(proxy) {
#ifdef CURL_DISABLE_PROXY
    return CURLE_NOT_BUILT_IN;
#else
    digest = &data->state.proxydigest;
    allocuserpwd = &data->state.aptr.proxyuserpwd;
    userp = data->state.aptr.proxyuser;
    passwdp = data->state.aptr.proxypasswd;
    authp = &data->state.authproxy;
#endif
  }
  else {
    digest = &data->state.digest;
    allocuserpwd = &data->state.aptr.userpwd;
    userp = data->state.aptr.user;
    passwdp = data->state.aptr.passwd;
    authp = &data->state.authhost;
  }

  Curl_safefree(*allocuserpwd);

  /* not set means empty */
  if(!userp)
    userp = "";

  if(!passwdp)
    passwdp = "";

#if defined(USE_WINDOWS_SSPI)
  have_chlg = digest->input_token ? TRUE : FALSE;
#else
  have_chlg = digest->nonce ? TRUE : FALSE;
#endif

  if(!have_chlg) {
    authp->done = FALSE;
    return CURLE_OK;
  }

  /* So IE browsers < v7 cut off the URI part at the query part when they
     evaluate the MD5 and some (IIS?) servers work with them so we may need to
     do the Digest IE-style. Note that the different ways cause different MD5
     sums to get sent.

     Apache servers can be set to do the Digest IE-style automatically using
     the BrowserMatch feature:
     https://httpd.apache.org/docs/2.2/mod/mod_auth_digest.html#msie

     Further details on Digest implementation differences:
     http://www.fngtps.com/2006/09/http-authentication
  */

  if(authp->iestyle) {
    tmp = strchr((char *)uripath, '?');
    if(tmp) {
      size_t urilen = tmp - (char *)uripath;
      /* typecast is fine here since the value is always less than 32 bits */
      path = (unsigned char *) aprintf("%.*s", (int)urilen, uripath);
    }
  }
  if(!tmp)
    path = (unsigned char *) strdup((char *) uripath);

  if(!path)
    return CURLE_OUT_OF_MEMORY;

  result = Curl_auth_create_digest_http_message(data, userp, passwdp, request,
                                                path, digest, &response, &len);
  free(path);
  if(result)
    return result;

  *allocuserpwd = aprintf("%sAuthorization: Digest %s\r\n",
                          proxy ? "Proxy-" : "",
                          response);
  free(response);
  if(!*allocuserpwd)
    return CURLE_OUT_OF_MEMORY;

  authp->done = TRUE;

  return CURLE_OK;
}